

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O2

size_t glTFCommon::Util::DecodeBase64(char *in,size_t inLength,uint8_t **out)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  uint8_t *__s;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  size_t __n;
  
  if ((inLength & 3) == 0) {
    if (inLength < 4) {
      *out = (uint8_t *)0x0;
      __n = 0;
    }
    else {
      __n = ((inLength * 3 >> 2) - (ulong)(in[inLength - 1] == '=')) -
            (ulong)(in[inLength - 2] == '=');
      __s = (uint8_t *)operator_new__(__n);
      *out = __s;
      memset(__s,0,__n);
      lVar6 = 1;
      uVar7 = 4;
      while( true ) {
        bVar1 = DATA<true>::tableDecodeBase64[in[uVar7 - 3]];
        bVar8 = bVar1 >> 4 | DATA<true>::tableDecodeBase64[in[uVar7 - 4]] << 2;
        cVar2 = in[uVar7 - 2];
        bVar3 = DATA<true>::tableDecodeBase64[cVar2];
        cVar4 = in[uVar7 - 1];
        bVar5 = DATA<true>::tableDecodeBase64[cVar4];
        if (inLength <= uVar7) break;
        (*out)[lVar6 + -1] = bVar8;
        (*out)[lVar6] = bVar3 >> 2 | bVar1 << 4;
        (*out)[lVar6 + 1] = bVar5 | bVar3 << 6;
        lVar6 = lVar6 + 3;
        uVar7 = uVar7 + 4;
      }
      (*out)[lVar6 + -1] = bVar8;
      if (cVar2 != '=') {
        (*out)[lVar6] = (bVar3 >> 2) + bVar1 * '\x10';
        lVar6 = lVar6 + 1;
      }
      if (cVar4 != '=') {
        (*out)[lVar6] = bVar5 | bVar3 << 6;
      }
    }
    return __n;
  }
  __assert_fail("inLength % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFCommon.cpp"
                ,0x32,"size_t glTFCommon::Util::DecodeBase64(const char *, size_t, uint8_t *&)");
}

Assistant:

size_t DecodeBase64(const char* in, size_t inLength, uint8_t*& out) {
    ai_assert(inLength % 4 == 0);

    if (inLength < 4) {
        out = 0;
        return 0;
    }

    int nEquals = int(in[inLength - 1] == '=') +
        int(in[inLength - 2] == '=');

    size_t outLength = (inLength * 3) / 4 - nEquals;
    out = new uint8_t[outLength];
    memset(out, 0, outLength);

    size_t i, j = 0;

    for (i = 0; i + 4 < inLength; i += 4) {
        uint8_t b0 = DecodeCharBase64(in[i]);
        uint8_t b1 = DecodeCharBase64(in[i + 1]);
        uint8_t b2 = DecodeCharBase64(in[i + 2]);
        uint8_t b3 = DecodeCharBase64(in[i + 3]);

        out[j++] = (uint8_t)((b0 << 2) | (b1 >> 4));
        out[j++] = (uint8_t)((b1 << 4) | (b2 >> 2));
        out[j++] = (uint8_t)((b2 << 6) | b3);
    }

    {
        uint8_t b0 = DecodeCharBase64(in[i]);
        uint8_t b1 = DecodeCharBase64(in[i + 1]);
        uint8_t b2 = DecodeCharBase64(in[i + 2]);
        uint8_t b3 = DecodeCharBase64(in[i + 3]);

        out[j++] = (uint8_t)((b0 << 2) | (b1 >> 4));
        if (b2 < 64) out[j++] = (uint8_t)((b1 << 4) | (b2 >> 2));
        if (b3 < 64) out[j++] = (uint8_t)((b2 << 6) | b3);
    }

    return outLength;
}